

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zt_log.c
# Opt level: O0

zt_log_ty * zt_log_logger(zt_log_ty *log)

{
  zt_log_ty *in_RDI;
  undefined8 local_8;
  
  if ((in_RDI == (zt_log_ty *)0x0) && (log_default_ptr == (zt_log_ty *)0x0)) {
    local_8 = zt_log_get_logger();
  }
  else {
    local_8 = zt_log_set_logger(in_RDI);
  }
  return local_8;
}

Assistant:

zt_log_ty *
zt_log_logger(zt_log_ty * log) {
    /* STATES:
     * log == NULL AND default == NULL           : create a new logger
     * log == NULL AND default == <logger>       : replace the current logger with log (NULL)
     * log == <logger> AND default == NULL       : replace the default logger with log
     * log == <logger> AND default == <logger>   : replace the default logger with log
     */

    /* if log is NULL and there is no default get one */
    if (log == NULL && log_default_ptr == NULL) {
        return zt_log_get_logger();
    }

    return zt_log_set_logger(log);
}